

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::TruncFun::GetFunctions(void)

{
  LogicalType varargs;
  InternalException *this;
  code *bind;
  code *__f;
  ScalarFunctionSet *in_RDI;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffdac;
  FunctionNullHandling in_stack_fffffffffffffdb8;
  bind_lambda_function_t in_stack_fffffffffffffdc0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_220;
  scalar_function_t func;
  string local_1e0;
  LogicalType local_1c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1a8;
  LogicalType local_190;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_178;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Numeric();
  other = local_220.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start;
  do {
    if (other == local_220.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_220);
      return in_RDI;
    }
    func.super__Function_base._M_manager = (_Manager_type)0x0;
    func._M_invoker = (_Invoker_type)0x0;
    func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    func.super__Function_base._M_functor._8_8_ = 0;
    __f = ScalarFunction::UnaryFunction<float,float,duckdb::TruncOperator>;
    bind = BindGenericRoundFunctionDecimal<duckdb::TruncDecimalOperator>;
    switch(other->id_) {
    case DATE:
    case TIME:
    case TIMESTAMP_SEC:
    case TIMESTAMP_MS:
    case TIMESTAMP:
    case TIMESTAMP_NS:
    case CHAR:
    case VARCHAR:
    case BLOB:
    case INTERVAL:
switchD_01e30659_caseD_f:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_1e0,"Unimplemented numeric type for function \"trunc\"",
                 (allocator *)&stack0xfffffffffffffdc7);
      InternalException::InternalException(this,&local_1e0);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case DECIMAL:
      goto switchD_01e30659_caseD_15;
    case FLOAT:
      break;
    case DOUBLE:
      __f = ScalarFunction::UnaryFunction<double,double,duckdb::TruncOperator>;
      break;
    default:
      if (1 < other->id_ - 0x31) goto switchD_01e30659_caseD_f;
    case TINYINT:
    case SMALLINT:
    case INTEGER:
    case BIGINT:
    case UTINYINT:
    case USMALLINT:
    case UINTEGER:
    case UBIGINT:
      __f = ScalarFunction::NopFunction;
    }
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)&func,
               __f);
    bind = (bind_scalar_function_t)0x0;
switchD_01e30659_caseD_15:
    LogicalType::LogicalType((LogicalType *)&local_1e0,other);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_1e0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_1a8,__l,(allocator_type *)&stack0xfffffffffffffdc7);
    LogicalType::LogicalType(&local_1c0,other);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    function(&local_178,&func);
    LogicalType::LogicalType(&local_190,INVALID);
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs._0_8_ = &local_190;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffda4;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffdac;
    ScalarFunction::ScalarFunction
              (&local_158,(vector<duckdb::LogicalType,_true> *)&local_1a8,&local_1c0,&local_178,bind
               ,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
               (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffdb8,
               in_stack_fffffffffffffdc0);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_158);
    ScalarFunction::~ScalarFunction(&local_158);
    LogicalType::~LogicalType(&local_190);
    ::std::_Function_base::~_Function_base(&local_178.super__Function_base);
    LogicalType::~LogicalType(&local_1c0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1a8);
    LogicalType::~LogicalType((LogicalType *)&local_1e0);
    ::std::_Function_base::~_Function_base(&func.super__Function_base);
    other = other + 1;
  } while( true );
}

Assistant:

ScalarFunctionSet TruncFun::GetFunctions() {
	ScalarFunctionSet trunc;
	for (auto &type : LogicalType::Numeric()) {
		scalar_function_t func = nullptr;
		bind_scalar_function_t bind_func = nullptr;
		//	Truncation of integers gets generated by some tools (e.g., Tableau/JDBC:Postgres)
		switch (type.id()) {
		case LogicalTypeId::FLOAT:
			func = ScalarFunction::UnaryFunction<float, float, TruncOperator>;
			break;
		case LogicalTypeId::DOUBLE:
			func = ScalarFunction::UnaryFunction<double, double, TruncOperator>;
			break;
		case LogicalTypeId::DECIMAL:
			bind_func = BindGenericRoundFunctionDecimal<TruncDecimalOperator>;
			break;
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
		case LogicalTypeId::HUGEINT:
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
		case LogicalTypeId::UHUGEINT:
			func = ScalarFunction::NopFunction;
			break;
		default:
			throw InternalException("Unimplemented numeric type for function \"trunc\"");
		}
		trunc.AddFunction(ScalarFunction({type}, type, func, bind_func));
	}
	return trunc;
}